

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O2

Memory * __thiscall
wasm::Module::addMemory
          (Module *this,unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *curr)

{
  Memory *pMVar1;
  string local_40;
  _Head_base<0UL,_wasm::Memory_*,_false> local_20;
  allocator<char> local_11;
  
  local_20._M_head_impl =
       (curr->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
       super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
       super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
  (curr->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl = (Memory *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"addMemory",&local_11);
  pMVar1 = addModuleElement<std::vector<std::unique_ptr<wasm::Memory,std::default_delete<wasm::Memory>>,std::allocator<std::unique_ptr<wasm::Memory,std::default_delete<wasm::Memory>>>>,std::unordered_map<wasm::Name,wasm::Memory*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Memory*>>>,wasm::Memory>
                     (&this->memories,&this->memoriesMap,
                      (unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)&local_20,
                      &local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr
            ((unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)&local_20);
  return pMVar1;
}

Assistant:

Memory* Module::addMemory(std::unique_ptr<Memory>&& curr) {
  return addModuleElement(memories, memoriesMap, std::move(curr), "addMemory");
}